

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressContinue_internal
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,U32 frame,
                 U32 lastFrameChunk)

{
  ZSTD_matchState_t *ms;
  void *iend;
  uint uVar1;
  uint uVar2;
  ZSTD_compressedBlockState_t *pZVar3;
  uint lastBlock;
  ushort uVar4;
  U32 UVar5;
  uint uVar6;
  size_t err_code;
  size_t sVar7;
  ulong uVar8;
  ZSTD_compressedBlockState_t *pZVar9;
  ushort uVar10;
  size_t sVar11;
  size_t sVar12;
  short *dst_00;
  size_t err_code_1;
  unsigned_long_long uVar13;
  bool bVar14;
  size_t sStack_a0;
  size_t local_80;
  void *local_70;
  
  if (cctx->stage == ZSTDcs_created) {
    sStack_a0 = 0xffffffffffffffc4;
  }
  else {
    if (cctx->stage == ZSTDcs_init && frame != 0) {
      local_80 = ZSTD_writeFrameHeader
                           (dst,dstCapacity,&cctx->appliedParams,cctx->pledgedSrcSizePlusOne - 1,
                            cctx->dictID);
      if (0xffffffffffffff88 < local_80) {
        return local_80;
      }
      bVar14 = dstCapacity < local_80;
      dstCapacity = dstCapacity - local_80;
      if (bVar14) {
        __assert_fail("fhSize <= dstCapacity",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x34e1,
                      "size_t ZSTD_compressContinue_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                     );
      }
      dst = (void *)((long)dst + local_80);
      cctx->stage = ZSTDcs_ongoing;
    }
    else {
      local_80 = 0;
    }
    sStack_a0 = local_80;
    if (srcSize != 0) {
      ms = &(cctx->blockState).matchState;
      UVar5 = ZSTD_window_update(&ms->window,src,srcSize);
      if (UVar5 == 0) {
        (cctx->blockState).matchState.nextToUpdate = (cctx->blockState).matchState.window.dictLimit;
      }
      if ((cctx->appliedParams).ldmParams.enableLdm != 0) {
        ZSTD_window_update(&(cctx->ldmState).window,src,srcSize);
      }
      if (frame == 0) {
        ZSTD_overflowCorrectIfNeeded
                  (ms,&cctx->workspace,&cctx->appliedParams,src,(void *)((long)src + srcSize));
        sStack_a0 = ZSTD_compressBlock_internal(cctx,dst,dstCapacity,src,srcSize,0);
      }
      else {
        uVar1 = (cctx->appliedParams).cParams.windowLog;
        if (0x1f < uVar1) {
          __assert_fail("cctx->appliedParams.cParams.windowLog <= ZSTD_WINDOWLOG_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x344a,
                        "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                       );
        }
        sVar11 = cctx->blockSize;
        if ((cctx->appliedParams).fParams.checksumFlag != 0) {
          ZSTD_XXH64_update(&cctx->xxhState,src,srcSize);
        }
        dst_00 = (short *)dst;
        local_70 = src;
        for (sVar12 = srcSize; sVar12 != 0; sVar12 = sVar12 - sVar11) {
          lastBlock = lastFrameChunk & 1;
          if (sVar11 < sVar12) {
            lastBlock = 0;
          }
          if (dstCapacity < 6) {
            return 0xffffffffffffffba;
          }
          if (sVar12 < sVar11) {
            sVar11 = sVar12;
          }
          iend = (void *)((long)local_70 + sVar11);
          ZSTD_overflowCorrectIfNeeded(ms,&cctx->workspace,&cctx->appliedParams,local_70,iend);
          uVar6 = (int)iend - *(int *)&(cctx->blockState).matchState.window.base;
          uVar2 = (cctx->blockState).matchState.loadedDictEnd;
          if (uVar6 < uVar2) {
            __assert_fail("blockEndIdx >= loadedDictEnd",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x21fe,
                          "void ZSTD_checkDictValidity(const ZSTD_window_t *, const void *, U32, U32 *, const ZSTD_matchState_t **)"
                         );
          }
          if (uVar2 + (1 << ((byte)uVar1 & 0x1f)) < uVar6) {
            (cctx->blockState).matchState.loadedDictEnd = 0;
            (cctx->blockState).matchState.dictMatchState = (ZSTD_matchState_t *)0x0;
          }
          uVar2 = (cctx->blockState).matchState.window.lowLimit;
          if ((cctx->blockState).matchState.nextToUpdate < uVar2) {
            (cctx->blockState).matchState.nextToUpdate = uVar2;
          }
          uVar4 = (ushort)lastBlock;
          if ((cctx->appliedParams).targetCBlockSize == 0) {
            sVar7 = ZSTD_compressBlock_internal
                              (cctx,(void *)((long)dst_00 + 3),dstCapacity - 3,local_70,sVar11,1);
            if (0xffffffffffffff88 < sVar7) {
              return sVar7;
            }
            uVar10 = 2;
            uVar8 = sVar11;
            if (sVar7 == 1) {
LAB_0013fcc1:
              *dst_00 = (uVar10 | uVar4) + (short)uVar8 * 8;
              *(char *)(dst_00 + 1) = (char)(uVar8 >> 0xd);
              uVar8 = sVar7 + 3;
            }
            else {
              if (sVar7 != 0) {
                uVar10 = 4;
                uVar8 = sVar7;
                goto LAB_0013fcc1;
              }
              uVar8 = sVar11 + 3;
              if (dstCapacity < uVar8) {
                return 0xffffffffffffffba;
              }
              *dst_00 = uVar4 + (short)sVar11 * 8;
              *(char *)(dst_00 + 1) = (char)(sVar11 >> 0xd);
              memcpy((void *)((long)dst_00 + 3),local_70,sVar11);
              if (0xffffffffffffff88 < uVar8) {
                return uVar8;
              }
            }
          }
          else {
            sVar7 = ZSTD_buildSeqStore(cctx,local_70,sVar11);
            if (0xffffffffffffff88 < sVar7) {
              return sVar7;
            }
            if ((sVar7 == 0) &&
               (uVar8 = ZSTD_compressSuperBlock(cctx,dst_00,dstCapacity,lastBlock),
               uVar8 != 0xffffffffffffffba)) {
              if (0xffffffffffffff88 < uVar8) {
                return uVar8;
              }
              if ((uVar8 == 0) || (sVar11 + 3 <= uVar8)) goto LAB_0013fba5;
              pZVar3 = (cctx->blockState).prevCBlock;
              pZVar9 = (cctx->blockState).nextCBlock;
              (cctx->blockState).prevCBlock = pZVar9;
              (cctx->blockState).nextCBlock = pZVar3;
            }
            else {
LAB_0013fba5:
              uVar8 = sVar11 + 3;
              if (dstCapacity < uVar8) {
                return 0xffffffffffffffba;
              }
              *dst_00 = uVar4 + (short)sVar11 * 8;
              *(char *)(dst_00 + 1) = (char)(sVar11 >> 0xd);
              memcpy((void *)((long)dst_00 + 3),local_70,sVar11);
              if (0xffffffffffffff88 < uVar8) {
                return uVar8;
              }
              pZVar9 = (cctx->blockState).prevCBlock;
            }
            if ((pZVar9->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
              (pZVar9->entropy).fse.offcode_repeatMode = FSE_repeat_check;
            }
            if (uVar8 == 0) {
              __assert_fail("cSize > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x3464,
                            "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                           );
            }
            if (sVar11 + 3 < uVar8) {
              __assert_fail("cSize <= blockSize + ZSTD_blockHeaderSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x3465,
                            "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                           );
            }
          }
          bVar14 = dstCapacity < uVar8;
          dstCapacity = dstCapacity - uVar8;
          if (bVar14) {
            __assert_fail("dstCapacity >= cSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x347d,
                          "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                         );
          }
          dst_00 = (short *)((long)dst_00 + uVar8);
          cctx->isFirstBlock = 0;
          local_70 = iend;
        }
        if ((lastFrameChunk != 0) && (dst < dst_00)) {
          cctx->stage = ZSTDcs_ending;
        }
        sStack_a0 = (long)dst_00 - (long)dst;
      }
      if (sStack_a0 < 0xffffffffffffff89) {
        uVar13 = srcSize + cctx->consumedSrcSize;
        cctx->consumedSrcSize = uVar13;
        sStack_a0 = sStack_a0 + local_80;
        cctx->producedCSize = cctx->producedCSize + sStack_a0;
        uVar8 = cctx->pledgedSrcSizePlusOne;
        if (uVar8 == 0 && (cctx->appliedParams).fParams.contentSizeFlag != 0) {
          __assert_fail("!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x34fe,
                        "size_t ZSTD_compressContinue_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                       );
        }
        sVar11 = 0xffffffffffffffb8;
        if (uVar13 + 1 <= uVar8) {
          sVar11 = sStack_a0;
        }
        if (uVar8 != 0) {
          sStack_a0 = sVar11;
        }
      }
    }
  }
  return sStack_a0;
}

Assistant:

static size_t ZSTD_compressContinue_internal (ZSTD_CCtx* cctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize,
                               U32 frame, U32 lastFrameChunk)
{
    ZSTD_matchState_t* const ms = &cctx->blockState.matchState;
    size_t fhSize = 0;

    DEBUGLOG(5, "ZSTD_compressContinue_internal, stage: %u, srcSize: %u",
                cctx->stage, (unsigned)srcSize);
    RETURN_ERROR_IF(cctx->stage==ZSTDcs_created, stage_wrong,
                    "missing init (ZSTD_compressBegin)");

    if (frame && (cctx->stage==ZSTDcs_init)) {
        fhSize = ZSTD_writeFrameHeader(dst, dstCapacity, &cctx->appliedParams,
                                       cctx->pledgedSrcSizePlusOne-1, cctx->dictID);
        FORWARD_IF_ERROR(fhSize);
        assert(fhSize <= dstCapacity);
        dstCapacity -= fhSize;
        dst = (char*)dst + fhSize;
        cctx->stage = ZSTDcs_ongoing;
    }

    if (!srcSize) return fhSize;  /* do not generate an empty block if no input */

    if (!ZSTD_window_update(&ms->window, src, srcSize)) {
        ms->nextToUpdate = ms->window.dictLimit;
    }
    if (cctx->appliedParams.ldmParams.enableLdm) {
        ZSTD_window_update(&cctx->ldmState.window, src, srcSize);
    }

    if (!frame) {
        /* overflow check and correction for block mode */
        ZSTD_overflowCorrectIfNeeded(
            ms, &cctx->workspace, &cctx->appliedParams,
            src, (BYTE const*)src + srcSize);
    }

    DEBUGLOG(5, "ZSTD_compressContinue_internal (blockSize=%u)", (unsigned)cctx->blockSize);
    {   size_t const cSize = frame ?
                             ZSTD_compress_frameChunk (cctx, dst, dstCapacity, src, srcSize, lastFrameChunk) :
                             ZSTD_compressBlock_internal (cctx, dst, dstCapacity, src, srcSize, 0 /* frame */);
        FORWARD_IF_ERROR(cSize);
        cctx->consumedSrcSize += srcSize;
        cctx->producedCSize += (cSize + fhSize);
        assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
        if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
            ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
            RETURN_ERROR_IF(
                cctx->consumedSrcSize+1 > cctx->pledgedSrcSizePlusOne,
                srcSize_wrong,
                "error : pledgedSrcSize = %u, while realSrcSize >= %u",
                (unsigned)cctx->pledgedSrcSizePlusOne-1,
                (unsigned)cctx->consumedSrcSize);
        }
        return cSize + fhSize;
    }
}